

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# delta_byte_array_decoder.cpp
# Opt level: O0

void __thiscall duckdb::DeltaByteArrayDecoder::InitializePage(DeltaByteArrayDecoder *this)

{
  PhysicalType PVar1;
  LogicalType *this_00;
  runtime_error *prVar2;
  type pRVar3;
  string_t *psVar4;
  Vector *pVVar5;
  ByteBuffer *pBVar6;
  char *__src;
  long *in_RDI;
  string_t sVar7;
  char *result_data;
  uint32_t str_len;
  idx_t i;
  string_t *string_data;
  uint32_t *suffix_data;
  uint32_t *prefix_data;
  ResizeableBuffer *suffix_buffer;
  ResizeableBuffer *prefix_buffer;
  idx_t suffix_count;
  idx_t prefix_count;
  Allocator *allocator;
  ResizeableBuffer *block;
  unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> *in_stack_ffffffffffffff28;
  Vector *in_stack_ffffffffffffff30;
  uint64_t in_stack_ffffffffffffff38;
  ByteBuffer *in_stack_ffffffffffffff40;
  void **in_stack_ffffffffffffff60;
  LogicalTypeId *in_stack_ffffffffffffff68;
  char *local_90;
  ulong local_80;
  idx_t *in_stack_ffffffffffffff98;
  long lVar8;
  ResizeableBuffer *in_stack_ffffffffffffffa0;
  long lVar9;
  ResizeableBuffer *in_stack_ffffffffffffffa8;
  Allocator *in_stack_ffffffffffffffb0;
  ulong local_38;
  ulong local_30;
  
  this_00 = ColumnReader::Type((ColumnReader *)*in_RDI);
  PVar1 = LogicalType::InternalType(this_00);
  if (PVar1 != VARCHAR) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    ::std::runtime_error::runtime_error
              (prVar2,"Delta Byte Array encoding is only supported for string/blob data");
    __cxa_throw(prVar2,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
  }
  pRVar3 = shared_ptr<duckdb::ResizeableBuffer,_true>::operator*
                     ((shared_ptr<duckdb::ResizeableBuffer,_true> *)in_stack_ffffffffffffff30);
  lVar9 = *in_RDI;
  lVar8 = *in_RDI;
  ReadDbpData(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
              in_stack_ffffffffffffff98);
  ReadDbpData(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
              in_stack_ffffffffffffff98);
  if (local_30 != local_38) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    ::std::runtime_error::runtime_error
              (prVar2,"DELTA_BYTE_ARRAY - prefix and suffix counts are different - corrupt file?");
    __cxa_throw(prVar2,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
  }
  if (local_30 == 0) {
    make_uniq<duckdb::Vector,duckdb::LogicalTypeId_const&,decltype(nullptr)>
              (in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
    unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator=
              ((unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> *)
               in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::~unique_ptr
              ((unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> *)0x23f9b1c);
  }
  else {
    lVar9 = *(long *)(lVar9 + 400);
    lVar8 = *(long *)(lVar8 + 0x1c0);
    make_uniq<duckdb::Vector,duckdb::LogicalTypeId_const&,unsigned_long&>
              (in_stack_ffffffffffffff68,(unsigned_long *)in_stack_ffffffffffffff60);
    unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator=
              ((unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> *)
               in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::~unique_ptr
              ((unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> *)0x23f9b77);
    in_RDI[2] = local_30;
    in_RDI[3] = 0;
    unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
              ((unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> *)
               in_stack_ffffffffffffff30);
    psVar4 = FlatVector::GetData<duckdb::string_t>((Vector *)0x23f9ba1);
    for (local_80 = 0; local_80 < local_30; local_80 = local_80 + 1) {
      ByteBuffer::available(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
      unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                ((unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> *)
                 in_stack_ffffffffffffff30);
      sVar7 = StringVector::EmptyString(in_stack_ffffffffffffff30,(idx_t)in_stack_ffffffffffffff28);
      *(long *)&psVar4[local_80].value = sVar7.value._0_8_;
      local_90 = sVar7.value._8_8_;
      psVar4[local_80].value.pointer.ptr = local_90;
      pVVar5 = (Vector *)string_t::GetDataWriteable((string_t *)in_stack_ffffffffffffff30);
      if (*(int *)(lVar9 + local_80 * 4) != 0) {
        if (local_80 == 0) {
LAB_023f9cb4:
          prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
          ::std::runtime_error::runtime_error
                    (prVar2,"DELTA_BYTE_ARRAY - prefix is out of range - corrupt file?");
          __cxa_throw(prVar2,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
        }
        in_stack_ffffffffffffff40 = (ByteBuffer *)(ulong)*(uint *)(lVar9 + local_80 * 4);
        in_stack_ffffffffffffff30 = pVVar5;
        pBVar6 = (ByteBuffer *)string_t::GetSize(psVar4 + (local_80 - 1));
        if (pBVar6 < in_stack_ffffffffffffff40) goto LAB_023f9cb4;
        pVVar5 = in_stack_ffffffffffffff30;
        __src = string_t::GetData((string_t *)in_stack_ffffffffffffff30);
        memcpy(in_stack_ffffffffffffff30,__src,(ulong)*(uint *)(lVar9 + local_80 * 4));
      }
      memcpy(&pVVar5->vector_type + *(uint *)(lVar9 + local_80 * 4),(pRVar3->super_ByteBuffer).ptr,
             (ulong)*(uint *)(lVar8 + local_80 * 4));
      ByteBuffer::inc((ByteBuffer *)in_stack_ffffffffffffff30,(uint64_t)in_stack_ffffffffffffff28);
      string_t::Finalize((string_t *)in_stack_ffffffffffffff40);
    }
  }
  return;
}

Assistant:

void DeltaByteArrayDecoder::InitializePage() {
	if (reader.Type().InternalType() != PhysicalType::VARCHAR) {
		throw std::runtime_error("Delta Byte Array encoding is only supported for string/blob data");
	}
	auto &block = *reader.block;
	auto &allocator = reader.reader.allocator;
	idx_t prefix_count, suffix_count;
	auto &prefix_buffer = reader.encoding_buffers[0];
	auto &suffix_buffer = reader.encoding_buffers[1];
	ReadDbpData(allocator, block, prefix_buffer, prefix_count);
	ReadDbpData(allocator, block, suffix_buffer, suffix_count);
	if (prefix_count != suffix_count) {
		throw std::runtime_error("DELTA_BYTE_ARRAY - prefix and suffix counts are different - corrupt file?");
	}
	if (prefix_count == 0) {
		// no values
		byte_array_data = make_uniq<Vector>(LogicalType::VARCHAR, nullptr);
		return;
	}
	auto prefix_data = reinterpret_cast<uint32_t *>(prefix_buffer.ptr);
	auto suffix_data = reinterpret_cast<uint32_t *>(suffix_buffer.ptr);
	byte_array_data = make_uniq<Vector>(LogicalType::VARCHAR, prefix_count);
	byte_array_count = prefix_count;
	delta_offset = 0;
	auto string_data = FlatVector::GetData<string_t>(*byte_array_data);
	for (idx_t i = 0; i < prefix_count; i++) {
		auto str_len = prefix_data[i] + suffix_data[i];
		block.available(suffix_data[i]);
		string_data[i] = StringVector::EmptyString(*byte_array_data, str_len);
		auto result_data = string_data[i].GetDataWriteable();
		if (prefix_data[i] > 0) {
			if (i == 0 || prefix_data[i] > string_data[i - 1].GetSize()) {
				throw std::runtime_error("DELTA_BYTE_ARRAY - prefix is out of range - corrupt file?");
			}
			memcpy(result_data, string_data[i - 1].GetData(), prefix_data[i]);
		}
		memcpy(result_data + prefix_data[i], block.ptr, suffix_data[i]);
		block.inc(suffix_data[i]);
		string_data[i].Finalize();
	}
}